

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraKateGenerator::GenerateFilesString_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  cmMakefile *pcVar1;
  cmSourceFile *this_00;
  bool bVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  pointer pbVar5;
  pointer ppcVar6;
  pointer ppcVar7;
  string s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  allocator local_b1;
  char *local_b0 [4];
  cmGlobalGenerator *local_90;
  pointer local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_50;
  
  pcVar3 = cmLocalGenerator::GetSourceDirectory(lg);
  std::__cxx11::string::string((string *)local_b0,pcVar3,(allocator *)&local_80);
  std::__cxx11::string::append((char *)local_b0);
  bVar2 = cmsys::SystemTools::FileExists(local_b0[0]);
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"\"git\": 1 ",(allocator *)&local_80);
  }
  else {
    cmLocalGenerator::GetSourceDirectory(lg);
    std::__cxx11::string::assign((char *)local_b0);
    std::__cxx11::string::append((char *)local_b0);
    bVar2 = cmsys::SystemTools::FileExists(local_b0[0]);
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"\"svn\": 1 ",(allocator *)&local_80);
    }
    else {
      cmLocalGenerator::GetSourceDirectory(lg);
      std::__cxx11::string::assign((char *)local_b0);
      std::__cxx11::string::append((char *)local_b0);
      local_80._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_80._M_impl.super__Rb_tree_header._M_header;
      local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      local_90 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      ppcVar7 = (local_90->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_80._M_impl.super__Rb_tree_header._M_header._M_right =
           local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      while (ppcVar7 !=
             (local_90->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        pcVar1 = (*ppcVar7)->Makefile;
        for (pbVar5 = (pcVar1->ListFiles).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar5 != (pcVar1->ListFiles).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
          std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_80,__return_storage_ptr__);
        }
        local_88 = ppcVar7;
        for (ppcVar6 = (pcVar1->SourceFiles).
                       super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            ppcVar6 !=
            (pcVar1->SourceFiles).
            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
          this_00 = *ppcVar6;
          std::__cxx11::string::string((string *)&local_50,"GENERATED",&local_b1);
          bVar2 = cmSourceFile::GetPropertyAsBool(this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (!bVar2) {
            cmSourceFile::GetFullPath(this_00,(string *)0x0);
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_80,__return_storage_ptr__);
          }
        }
        ppcVar7 = local_88 + 1;
      }
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      for (p_Var4 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &local_80._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_80);
    }
  }
  std::__cxx11::string::~string((string *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GenerateFilesString(
  const cmLocalGenerator* lg) const
{
  std::string s = lg->GetSourceDirectory();
  s += "/.git";
  if (cmSystemTools::FileExists(s.c_str())) {
    return std::string("\"git\": 1 ");
  }

  s = lg->GetSourceDirectory();
  s += "/.svn";
  if (cmSystemTools::FileExists(s.c_str())) {
    return std::string("\"svn\": 1 ");
  }

  s = lg->GetSourceDirectory();
  s += "/";

  std::set<std::string> files;
  std::string tmp;
  const std::vector<cmLocalGenerator*>& lgs =
    this->GlobalGenerator->GetLocalGenerators();

  for (std::vector<cmLocalGenerator*>::const_iterator it = lgs.begin();
       it != lgs.end(); it++) {
    cmMakefile* makefile = (*it)->GetMakefile();
    const std::vector<std::string>& listFiles = makefile->GetListFiles();
    for (std::vector<std::string>::const_iterator lt = listFiles.begin();
         lt != listFiles.end(); lt++) {
      tmp = *lt;
      {
        files.insert(tmp);
      }
    }

    const std::vector<cmSourceFile*>& sources = makefile->GetSourceFiles();
    for (std::vector<cmSourceFile*>::const_iterator sfIt = sources.begin();
         sfIt != sources.end(); sfIt++) {
      cmSourceFile* sf = *sfIt;
      if (sf->GetPropertyAsBool("GENERATED")) {
        continue;
      }

      tmp = sf->GetFullPath();
      files.insert(tmp);
    }
  }

  const char* sep = "";
  tmp = "\"list\": [";
  for (std::set<std::string>::const_iterator it = files.begin();
       it != files.end(); ++it) {
    tmp += sep;
    tmp += " \"";
    tmp += *it;
    tmp += "\"";
    sep = ",";
  }
  tmp += "] ";

  return tmp;
}